

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  uint uVar1;
  bool bVar2;
  undefined1 uVar3;
  GCstr *pGVar4;
  char *pcVar5;
  int in_EDX;
  cTValue *in_RSI;
  cTValue *in_RDI;
  MSize len_1;
  MSize len;
  int i;
  char *buffer;
  MSize tlen;
  cTValue *mo;
  int n;
  int fromc;
  cTValue *in_stack_fffffffffffffdf8;
  cTValue *in_stack_fffffffffffffe00;
  cTValue *in_stack_fffffffffffffe08;
  MMS in_stack_fffffffffffffe1c;
  cTValue *in_stack_fffffffffffffe20;
  cTValue *in_stack_fffffffffffffe28;
  cTValue *pcVar6;
  cTValue *in_stack_fffffffffffffe30;
  ErrMsg opm;
  cTValue *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  int local_1b4;
  uint local_1a4;
  cTValue *local_1a0;
  int local_194;
  int local_18c;
  cTValue *local_188;
  
  local_18c = in_EDX;
  local_188 = in_RSI;
  if (in_EDX < 0) {
    local_18c = -in_EDX;
  }
  while ((local_194 = 1, *(int *)((long)local_188 + -4) == -5 ||
         (*(uint *)((long)local_188 + -4) < 0xffff0000))) {
    if ((local_188->field_2).it == 0xfffffffb) {
      bVar2 = true;
    }
    else if ((local_188->field_2).it < 0xffff0000) {
      in_stack_fffffffffffffe30 = in_RDI;
      in_stack_fffffffffffffe38 = local_188;
      pGVar4 = lj_str_fromnumber((lua_State *)&in_stack_fffffffffffffe00->field_2,
                                 in_stack_fffffffffffffdf8);
      (in_stack_fffffffffffffe38->u32).lo = (uint32_t)pGVar4;
      (in_stack_fffffffffffffe38->field_2).it = 0xfffffffb;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    if (!bVar2) break;
    if (*(int *)((ulong)(local_188->u32).lo + 0xc) == 0) {
      pcVar6 = local_188 + -1;
      if ((*(int *)((long)local_188 + -4) != -5) && (*(uint *)((long)local_188 + -4) < 0xffff0000))
      {
        in_stack_fffffffffffffe20 = in_RDI;
        pGVar4 = lj_str_fromnumber((lua_State *)&in_stack_fffffffffffffe00->field_2,
                                   in_stack_fffffffffffffdf8);
        (pcVar6->u32).lo = (uint32_t)pGVar4;
        (pcVar6->field_2).it = 0xfffffffb;
        in_stack_fffffffffffffe28 = pcVar6;
      }
    }
    else {
      local_1a4 = *(int *)((ulong)(local_188->u32).lo + 0xc);
      local_194 = 1;
      while( true ) {
        in_stack_fffffffffffffe1c = in_stack_fffffffffffffe1c & 0xffffff;
        if (local_194 <= local_18c) {
          pcVar6 = local_188 + -(long)local_194;
          if ((pcVar6->field_2).it == 0xfffffffb) {
            uVar3 = 1;
          }
          else if ((pcVar6->field_2).it < 0xffff0000) {
            in_stack_fffffffffffffe08 = in_RDI;
            pGVar4 = lj_str_fromnumber((lua_State *)&in_stack_fffffffffffffe00->field_2,
                                       in_stack_fffffffffffffdf8);
            (pcVar6->u32).lo = (uint32_t)pGVar4;
            (pcVar6->field_2).it = 0xfffffffb;
            uVar3 = 1;
          }
          else {
            uVar3 = 0;
          }
          in_stack_fffffffffffffe1c = CONCAT13(uVar3,(int3)in_stack_fffffffffffffe1c);
        }
        if ((char)(in_stack_fffffffffffffe1c >> 0x18) == '\0') break;
        uVar1 = *(uint *)((ulong)local_188[-(long)local_194].u32.lo + 0xc);
        if (0x7fffff00 - local_1a4 <= uVar1) {
          lj_err_msg((lua_State *)&in_stack_fffffffffffffe00->field_2,
                     (ErrMsg)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
        }
        local_1a4 = uVar1 + local_1a4;
        local_194 = local_194 + 1;
      }
      pcVar5 = lj_str_needbuf((lua_State *)&in_stack_fffffffffffffe00->field_2,
                              (SBuf *)&in_stack_fffffffffffffdf8->field_2,0);
      local_1a4 = 0;
      local_194 = local_194 + -1;
      for (local_1b4 = local_194; -1 < local_1b4; local_1b4 = local_1b4 + -1) {
        in_stack_fffffffffffffe44 = *(uint *)((ulong)local_188[-(long)local_1b4].u32.lo + 0xc);
        memcpy(pcVar5 + local_1a4,(void *)((ulong)local_188[-(long)local_1b4].u32.lo + 0x10),
               (ulong)in_stack_fffffffffffffe44);
        local_1a4 = in_stack_fffffffffffffe44 + local_1a4;
      }
      in_stack_fffffffffffffe00 = local_188 + -(long)local_194;
      in_stack_fffffffffffffdf8 = in_RDI;
      pGVar4 = lj_str_new((lua_State *)&in_stack_fffffffffffffe38->field_2,
                          (char *)&in_stack_fffffffffffffe30->u64,(size_t)in_stack_fffffffffffffe28)
      ;
      (in_stack_fffffffffffffe00->u32).lo = (uint32_t)pGVar4;
      (in_stack_fffffffffffffe00->field_2).it = 0xfffffffb;
    }
    local_18c = local_18c - local_194;
    local_188 = local_188 + -(long)local_194;
    if (local_18c < 1) {
      if (*(uint *)((ulong)in_RDI[1].u32.lo + 0x24) <= *(uint *)((ulong)in_RDI[1].u32.lo + 0x20)) {
        if (in_EDX >= 0) {
          in_RDI[3].u64 =
               in_RDI[2].u64 +
               (long)(int)(uint)*(byte *)((ulong)*(uint *)((ulong)*(uint *)(in_RDI[2].u64 - 8) +
                                                          0x10) - 0x39) * 8;
        }
        lj_gc_step((lua_State *)&in_stack_fffffffffffffe08->field_2);
      }
      return (TValue *)0x0;
    }
  }
  opm = (ErrMsg)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  local_1a0 = lj_meta_lookup((lua_State *)&in_stack_fffffffffffffe28->field_2,
                             in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  if (((local_1a0->field_2).it == 0xffffffff) &&
     (local_1a0 = lj_meta_lookup((lua_State *)&in_stack_fffffffffffffe28->field_2,
                                 in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c),
     (local_1a0->field_2).it == 0xffffffff)) {
    lj_err_optype((lua_State *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                  in_stack_fffffffffffffe38,opm);
  }
  local_188[2].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)local_188;
  local_188[1] = local_188[-1];
  *local_188 = *local_1a0;
  local_188[-1].n = 3.50588982288949e-320;
  return local_188 + 1;
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    int n = 1;
    if (!(tvisstr(top-1) || tvisnumber(top-1)) || !tostring(L, top)) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2, top);  /* Careful with the order of stack copies! */
      copyTV(L, top+1, top-1);
      copyTV(L, top, mo);
      setcont(top-1, lj_cont_cat);
      return top+1;  /* Trigger metamethod call. */
    } else if (strV(top)->len == 0) {  /* Shortcut. */
      (void)tostring(L, top-1);
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      MSize tlen = strV(top)->len;
      char *buffer;
      int i;
      for (n = 1; n <= left && tostring(L, top-n); n++) {
	MSize len = strV(top-n)->len;
	if (len >= LJ_MAX_STR - tlen)
	  lj_err_msg(L, LJ_ERR_STROV);
	tlen += len;
      }
      buffer = lj_str_needbuf(L, &G(L)->tmpbuf, tlen);
      n--;
      tlen = 0;
      for (i = n; i >= 0; i--) {
	MSize len = strV(top-i)->len;
	memcpy(buffer + tlen, strVdata(top-i), len);
	tlen += len;
      }
      setstrV(L, top-n, lj_str_new(L, buffer, tlen));
    }
    left -= n;
    top -= n;
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}